

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O0

ostream * tcu::Format::operator<<
                    (ostream *str,
                    Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *fmt)

{
  bool bVar1;
  Hex<2UL> hex;
  HexIterator<unsigned_char,_const_unsigned_char_*> local_20;
  HexIterator<unsigned_char,_const_unsigned_char_*> cur;
  Array<tcu::Format::HexIterator<unsigned_char,_const_unsigned_char_*>_> *fmt_local;
  ostream *str_local;
  
  cur.m_iter = (uchar *)fmt;
  std::operator<<(str,"{ ");
  local_20.m_iter = *cur.m_iter;
  while (bVar1 = HexIterator<unsigned_char,_const_unsigned_char_*>::operator!=
                           (&local_20,
                            (HexIterator<unsigned_char,_const_unsigned_char_*> *)(cur.m_iter + 8)),
        bVar1) {
    bVar1 = HexIterator<unsigned_char,_const_unsigned_char_*>::operator!=
                      (&local_20,(HexIterator<unsigned_char,_const_unsigned_char_*> *)cur.m_iter);
    if (bVar1) {
      std::operator<<(str,", ");
    }
    hex = HexIterator<unsigned_char,_const_unsigned_char_*>::operator*(&local_20);
    operator<<(str,hex);
    HexIterator<unsigned_char,_const_unsigned_char_*>::operator++(&local_20);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}